

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.h
# Opt level: O1

void __thiscall
google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event::Event
          (Event *this,Event *other)

{
  pointer pcVar1;
  
  this->type_ = other->type_;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (other->name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name_,pcVar1,pcVar1 + (other->name_)._M_string_length);
  (this->value_)._vptr_DataPiece = (_func_int **)&PTR__DataPiece_003c8cd8;
  (this->value_).type_ = (other->value_).type_;
  DataPiece::InternalCopy(&this->value_,&other->value_);
  (this->value_storage_)._M_dataplus._M_p = (pointer)&(this->value_storage_).field_2;
  (this->value_storage_)._M_string_length = 0;
  (this->value_storage_).field_2._M_local_buf[0] = '\0';
  DeepCopy(this);
  return;
}

Assistant:

Event(const Event& other)
          : type_(other.type_), name_(other.name_), value_(other.value_) {
        DeepCopy();
      }